

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

void dxil_spv::CFGStructurizer::isolate_structured
               (UnorderedSet<CFGNode_*> *nodes,CFGNode *header,CFGNode *merge)

{
  pointer ppCVar1;
  size_type sVar2;
  pointer ppCVar3;
  CFGNode *pred;
  CFGNode *local_30;
  
  ppCVar1 = (merge->pred).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar3 = (merge->pred).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar3 != ppCVar1;
      ppCVar3 = ppCVar3 + 1) {
    local_30 = *ppCVar3;
    if (local_30 != header) {
      sVar2 = std::
              _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&nodes->_M_h,&local_30);
      if (sVar2 == 0) {
        std::__detail::
        _Insert_base<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)nodes,&local_30);
        isolate_structured(nodes,header,local_30);
      }
    }
  }
  return;
}

Assistant:

void CFGStructurizer::isolate_structured(UnorderedSet<CFGNode *> &nodes, const CFGNode *header,
                                         const CFGNode *merge)
{
	for (auto *pred : merge->pred)
	{
		if (pred != header && nodes.count(pred) == 0)
		{
			nodes.insert(pred);
			isolate_structured(nodes, header, pred);
		}
	}
}